

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lock.cpp
# Opt level: O1

bool __thiscall Threading::Event::_Wait(Event *this,TimeOut *rcxTO)

{
  bool bVar1;
  __time_t _Var2;
  __suseconds_t _Var3;
  int iVar4;
  int iVar5;
  Event EVar6;
  timeval tOut;
  timespec abstime;
  timeval local_60;
  timeval local_50;
  timespec local_40;
  
  if (rcxTO->duration == 0) {
    iVar4 = pthread_mutex_trylock((pthread_mutex_t *)this);
    if (iVar4 == 0) {
      EVar6 = this[0x29];
      if ((this[0x29] == (Event)0x1) && (this[0x28] == (Event)0x0)) {
        this[0x29] = (Event)0x0;
      }
    }
    else {
      EVar6 = (Event)0x0;
    }
  }
  else {
    if (rcxTO->duration != 0xffffffff) {
      gettimeofday(&local_60,(__timezone_ptr_t)0x0);
      local_60.tv_usec = (ulong)((rcxTO->duration % 1000) * 1000) + local_60.tv_usec;
      local_60.tv_sec = (ulong)rcxTO->duration / 1000 + local_60.tv_sec;
      if (1000000 < local_60.tv_usec) {
        local_60.tv_sec = local_60.tv_sec + 1;
        local_60.tv_usec = local_60.tv_usec + -1000000;
      }
      _Var3 = local_60.tv_usec;
      _Var2 = local_60.tv_sec;
      local_40.tv_sec = local_60.tv_sec;
      local_40.tv_nsec = local_60.tv_usec * 1000;
      EVar6 = (Event)0x0;
      gettimeofday(&local_50,(__timezone_ptr_t)0x0);
      bVar1 = _Var3 <= local_50.tv_usec && _Var2 <= local_50.tv_sec;
      if (_Var3 > local_50.tv_usec || _Var2 > local_50.tv_sec) {
        iVar4 = pthread_mutex_trylock((pthread_mutex_t *)this);
        if (iVar4 != 0) {
          do {
            sched_yield();
            EVar6 = (Event)0x0;
            gettimeofday(&local_50,(__timezone_ptr_t)0x0);
            bVar1 = _Var3 <= local_50.tv_usec && _Var2 <= local_50.tv_sec;
            if (bVar1) goto LAB_0010de14;
            iVar4 = pthread_mutex_trylock((pthread_mutex_t *)this);
          } while (iVar4 != 0);
        }
        if (bVar1) {
LAB_0010dd39:
          EVar6 = (Event)0x0;
        }
        else {
          if ((this[0x29] == (Event)0x0) && (this[0x29] == (Event)0x0)) {
            EVar6 = (Event)0x0;
            do {
              iVar4 = 4;
              while (iVar4 == 4) {
                iVar4 = pthread_cond_timedwait
                                  ((pthread_cond_t *)(this + 0x30),(pthread_mutex_t *)this,&local_40
                                  );
              }
              if (iVar4 != 0) {
                if (((byte)EVar6 & 1) == 0) goto LAB_0010dd39;
                break;
              }
              EVar6 = this[0x29];
            } while (EVar6 == (Event)0x0);
          }
          EVar6 = (Event)0x1;
          if (this[0x28] == (Event)0x0) {
            this[0x29] = (Event)0x0;
            EVar6 = (Event)0x1;
          }
        }
      }
LAB_0010de14:
      if (bVar1) {
        return (bool)EVar6;
      }
      goto LAB_0010de19;
    }
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar4 == 0) {
      if ((this[0x29] != (Event)0x0) || (this[0x29] != (Event)0x0)) {
LAB_0010dd4c:
        EVar6 = (Event)0x1;
        if (this[0x28] == (Event)0x0) {
          this[0x29] = (Event)0x0;
          EVar6 = (Event)0x1;
        }
        goto joined_r0x0010dd7d;
      }
      EVar6 = (Event)0x0;
      do {
        while (iVar5 = pthread_cond_wait((pthread_cond_t *)(this + 0x30),(pthread_mutex_t *)this),
              iVar5 != 4) {
          if (iVar5 != 0) goto LAB_0010dc26;
          EVar6 = this[0x29];
          if (EVar6 != (Event)0x0) goto LAB_0010dd4c;
        }
      } while (((byte)EVar6 & 1) == 0);
    }
LAB_0010dc26:
    EVar6 = (Event)0x0;
  }
joined_r0x0010dd7d:
  if (iVar4 != 0) {
    return (bool)EVar6;
  }
LAB_0010de19:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return (bool)EVar6;
}

Assistant:

bool Threading::Event::_Wait(const TimeOut & rcxTO) volatile
{
  #ifndef _POSIX
    bool isOkay = false;
    // compute time delay
    portTickType  tickDelay = rcxTO == Infinite ? portMAX_DELAY : (rcxTO == InstantCheck ? 0 : rcxTO / portTICK_RATE_MS);
    portBASE_TYPE  result;
    unsigned portLONG ulVar = 0;

    // The value in the queue must be removed
    if (!manualReset)
    {
        // The queue is automatically freed
        return xQueueReceive(xQueue, &ulVar, tickDelay) == pdTRUE;
    }
    // The queue is not automatically freed
    return xQueuePeek(xQueue, &ulVar, tickDelay) == pdTRUE;
  #else
    bool isOkay = false;
    if (rcxTO == Infinite)
    {
        bool bState = false;
        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int mutexLockSuccess = pthread_mutex_lock((HMUTEX*)&event), retValue = 0;
        if (mutexLockSuccess == 0)
        {
            bState = state;
            if (bState)
            {
                // Is it in auto reset mode ?
                if (!manualReset) state = false;
                isOkay = true;
            } else
            {
                // The variable is not set, so wait state changing
                while (!bState)
                {
                    // pthread_cond_wait release the mxEvent mutex and
                    // lock the condition atomically
                    // Because if any other thread wants to modify the state
                    // it has to lock the mutex, the change will be protected then
                    if ((retValue = pthread_cond_wait((pthread_cond_t*)&condition, (HMUTEX*)&event)) == EINTR) continue;
                    if (retValue != 0)
                    {   // An error occurred
                        isOkay = false; break;
                    }
                    bState = state;
                }

                if (!retValue)
                {
                    if (!manualReset) state = false;
                    isOkay = true;
                }
            }

        } // else return false; // No more needed with cleanup handlers
        // Unlock the mutex here
        pthread_cleanup_pop(mutexLockSuccess == 0);
        return isOkay;
    }
    else if (rcxTO == InstantCheck)
    {
        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int retValue = pthread_mutex_trylock((HMUTEX*)&event);
        if (retValue == 0)
        {
            isOkay = state;
            // Is it in auto reset mode ?
            if (state && !manualReset) state = false;

        } //else return false; // No more needed with cleanup handlers
        // Unlock the mutex here
        pthread_cleanup_pop(retValue == 0);
        return isOkay;
    }
    else // Wait with time out
    {
        // Process the absolute time for timeout
        struct timespec abstime;
        struct timeval tOut;
        gettimeofday(&tOut, NULL);
        tOut.tv_usec += (uint32)(rcxTO % 1000) * 1000;
        tOut.tv_sec += (uint32)rcxTO / 1000;
        if (tOut.tv_usec > 1000000)
        { tOut.tv_sec ++; tOut.tv_usec -= 1000000;  }
        abstime.tv_sec = tOut.tv_sec;
        abstime.tv_nsec = tOut.tv_usec * 1000;

        // First try to lock the mutex
        // Sadly, we must poll here

        // Install clean up handlers
        pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
        int mutexLockSuccess = -1, retval = 0;
        // Poll to get the mutex
        while (stillBefore(&tOut))
        {
            mutexLockSuccess = pthread_mutex_trylock((HMUTEX*)&event);
            if (mutexLockSuccess == 0) break;
            // We didn't get the mutex, so sleep a little (to avoid polling)
            sched_yield();
        }
        if (mutexLockSuccess == 0)
        {   // We now have the mutex, so check the state
            bool bState = state;
            if (bState)
            {
                // Is it in auto reset mode ?
                if (!manualReset) state = false;
                isOkay = true;
            } else
            {   // Unset here, so wait for the condition
                // The variable is not set, so wait state changing
                while (!bState)
                {
                    retval = EINTR;
                    while (retval == EINTR) retval = pthread_cond_timedwait((pthread_cond_t*)&condition, (HMUTEX*)&event, &abstime);

                    if (retval != 0) //== ETIMEDOUT)
                    {   // No change in the specified time, so release the mutex and return
                        break;
                    }

                    // A thread could have reset a unset state, thus causing condition
                    // broadcasting. We have to make sure the state is good now
                    bState = state;
                }

                if (!retval)
                {
                    if (!manualReset) state = false;
                    isOkay = true;
                }
            }
        }
        // Unlock the mutex here
        pthread_cleanup_pop(mutexLockSuccess == 0);
        return isOkay;
    }
  #endif
}